

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void deinterlace_row(png_bytep buffer,png_const_bytep row,uint pixel_size,png_uint_32 w,int pass,
                    int littleendian)

{
  undefined1 local_38;
  undefined4 local_30;
  png_uint_32 xstep;
  png_uint_32 xout;
  png_uint_32 xin;
  int littleendian_local;
  int pass_local;
  png_uint_32 w_local;
  uint pixel_size_local;
  png_const_bytep row_local;
  png_bytep buffer_local;
  
  local_30 = (pass & 1U) << (3U - (char)(pass + 1 >> 1) & 0x1f) & 7;
  if (pass < 2) {
    local_38 = 3;
  }
  else {
    local_38 = (byte)(7 - pass >> 1);
  }
  xstep = 0;
  for (; local_30 < w; local_30 = (1 << (local_38 & 0x1f)) + local_30) {
    pixel_copy(buffer,local_30,row,xstep,pixel_size,littleendian);
    xstep = xstep + 1;
  }
  return;
}

Assistant:

static void
deinterlace_row(png_bytep buffer, png_const_bytep row,
   unsigned int pixel_size, png_uint_32 w, int pass, int littleendian)
{
   /* The inverse of the above, 'row' is part of row 'y' of the output image,
    * in 'buffer'.  The image is 'w' wide and this is pass 'pass', distribute
    * the pixels of row into buffer and return the number written (to allow
    * this to be checked).
    */
   png_uint_32 xin, xout, xstep;

   xout = PNG_PASS_START_COL(pass);
   xstep = 1U<<PNG_PASS_COL_SHIFT(pass);

   for (xin=0; xout<w; xout+=xstep)
   {
      pixel_copy(buffer, xout, row, xin, pixel_size, littleendian);
      ++xin;
   }
}